

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
initialize_with_string_view
          (basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          string_view_type sv,error_code *ec)

{
  const_pointer pvVar1;
  size_type sVar2;
  ulong uVar3;
  undefined8 in_RCX;
  long lVar4;
  long *in_RDI;
  type tVar5;
  size_t offset;
  type r;
  size_t in_stack_ffffffffffffffa8;
  basic_csv_parser<char,_std::allocator<char>_> *this_00;
  error_code *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  tVar5 = unicode_traits::detect_encoding_from_bom<char>
                    ((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((tVar5.encoding == utf8) || (tVar5.encoding == undetected)) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    lVar4 = (long)tVar5.ptr - (long)pvVar1;
    this_00 = (basic_csv_parser<char,_std::allocator<char>_> *)(in_RDI + 5);
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    pvVar1 = pvVar1 + lVar4;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    basic_csv_parser<char,_std::allocator<char>_>::update(this_00,pvVar1,sVar2 - lVar4);
    uVar3 = (**(code **)(*in_RDI + 0x18))();
    if ((uVar3 & 1) == 0) {
      (**(code **)(*in_RDI + 0x40))(in_RDI,in_RCX);
    }
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffffb0,(json_errc)(in_stack_ffffffffffffffa8 >> 0x20));
  }
  return;
}

Assistant:

void initialize_with_string_view(string_view_type sv, std::error_code& ec)
    {
        auto r = unicode_traits::detect_encoding_from_bom(sv.data(), sv.size());
        if (!(r.encoding == unicode_traits::encoding_kind::utf8 || r.encoding == unicode_traits::encoding_kind::undetected))
        {
            ec = json_errc::illegal_unicode_character;
            return;
        }
        std::size_t offset = (r.ptr - sv.data());
        parser_.update(sv.data()+offset,sv.size()-offset);
        if (!done())
        {
            next(ec);
        }
    }